

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void av1_setup_pred_block
               (MACROBLOCKD *xd,buf_2d *dst,YV12_BUFFER_CONFIG *src,scale_factors *scale,
               scale_factors *scale_uv,int num_planes)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  MB_MODE_INFO *pMVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  scale_factors *psVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int *piVar17;
  
  dst->buf = (src->field_5).field_0.y_buffer;
  dst->stride = (src->field_4).field_0.y_stride;
  dst[1].buf = (src->field_5).field_0.u_buffer;
  dst[2].buf = (src->field_5).field_0.v_buffer;
  iVar9 = (src->field_4).field_0.uv_stride;
  dst[2].stride = iVar9;
  dst[1].stride = iVar9;
  uVar1 = xd->mi_row;
  uVar2 = xd->mi_col;
  uVar16 = 0;
  uVar13 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar13 = uVar16;
  }
  piVar17 = &xd->plane[0].subsampling_y;
  for (; uVar13 << 5 != uVar16; uVar16 = uVar16 + 0x20) {
    pMVar7 = *xd->mi;
    psVar11 = scale_uv;
    if (uVar16 == 0) {
      psVar11 = scale;
    }
    uVar8._0_1_ = pMVar7->bsize;
    uVar8._1_1_ = pMVar7->partition;
    uVar8._2_1_ = pMVar7->mode;
    uVar8._3_1_ = pMVar7->uv_mode;
    uVar14 = (uint)((0x20005UL >> ((ulong)uVar8 & 0x3f) & 1) != 0);
    if (*piVar17 == 0) {
      uVar14 = 0;
    }
    uVar8 = (uint)((0x10003UL >> ((ulong)uVar8 & 0x3f) & 1) != 0);
    if (piVar17[-1] == 0) {
      uVar8 = 0;
    }
    iVar9 = (int)((~uVar8 & uVar2) << 2) >> ((byte)piVar17[-1] & 0x1f);
    iVar15 = (int)((~uVar14 & uVar1) << 2) >> ((byte)*piVar17 & 0x1f);
    if (psVar11 != (scale_factors *)0x0) {
      iVar3 = psVar11->x_scale_fp;
      if ((long)iVar3 != -1) {
        iVar4 = psVar11->y_scale_fp;
        if (((long)iVar4 != -1) && (iVar4 != 0x4000 || iVar3 != 0x4000)) {
          lVar12 = (long)(iVar3 * 8 + -0x20000) + (long)iVar9 * (long)iVar3;
          if (lVar12 < 0) {
            iVar9 = -(int)((ulong)(0x80 - lVar12) >> 8);
          }
          else {
            iVar9 = (int)((ulong)(lVar12 + 0x80) >> 8);
          }
          lVar12 = (long)(iVar4 * 8 + -0x20000) + (long)iVar15 * (long)iVar4;
          if (lVar12 < 0) {
            iVar15 = -(int)((ulong)(0x80 - lVar12) >> 8);
          }
          else {
            iVar15 = (int)((ulong)(lVar12 + 0x80) >> 8);
          }
          iVar9 = iVar9 >> 6;
          iVar15 = iVar15 >> 6;
        }
      }
    }
    lVar12 = *(long *)((long)&dst->buf + uVar16);
    uVar10 = (ulong)(uVar16 != 0);
    uVar5 = *(undefined4 *)((long)src->store_buf_adr + uVar10 * 4 + -0x38);
    uVar6 = *(undefined4 *)((long)src->store_buf_adr + uVar10 * 4 + -0x30);
    *(long *)((long)&dst->buf + uVar16) =
         iVar9 + lVar12 + (long)iVar15 * (long)*(int *)((long)&dst->stride + uVar16);
    *(long *)((long)&dst->buf0 + uVar16) = lVar12;
    *(undefined4 *)((long)&dst->width + uVar16) = uVar5;
    *(undefined4 *)((long)&dst->height + uVar16) = uVar6;
    piVar17 = piVar17 + 0x28c;
  }
  return;
}

Assistant:

void av1_setup_pred_block(const MACROBLOCKD *xd,
                          struct buf_2d dst[MAX_MB_PLANE],
                          const YV12_BUFFER_CONFIG *src,
                          const struct scale_factors *scale,
                          const struct scale_factors *scale_uv,
                          const int num_planes) {
  dst[0].buf = src->y_buffer;
  dst[0].stride = src->y_stride;
  dst[1].buf = src->u_buffer;
  dst[2].buf = src->v_buffer;
  dst[1].stride = dst[2].stride = src->uv_stride;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  for (int i = 0; i < num_planes; ++i) {
    setup_pred_plane(dst + i, xd->mi[0]->bsize, dst[i].buf,
                     i ? src->uv_crop_width : src->y_crop_width,
                     i ? src->uv_crop_height : src->y_crop_height,
                     dst[i].stride, mi_row, mi_col, i ? scale_uv : scale,
                     xd->plane[i].subsampling_x, xd->plane[i].subsampling_y);
  }
}